

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall sglr::GLContext::deleteTextures(GLContext *this,int numTextures,deUint32 *textures)

{
  deUint32 *__k;
  ulong uVar1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar2;
  
  uVar1 = (ulong)(uint)numTextures;
  if (0 < numTextures) {
    __k = textures;
    do {
      pVar2 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::equal_range(&(this->m_allocatedTextures)._M_t,__k);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&(this->m_allocatedTextures)._M_t,(_Base_ptr)pVar2.first._M_node,
                     (_Base_ptr)pVar2.second._M_node);
      __k = __k + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  glu::CallLogWrapper::glDeleteTextures(this->m_wrapper,numTextures,textures);
  return;
}

Assistant:

void GLContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
		m_allocatedTextures.erase(textures[i]);
	m_wrapper->glDeleteTextures(numTextures, textures);
}